

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O2

void __thiscall
phmap::priv::
btree_iterator<const_phmap::priv::btree_node<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_false>_>,_const_std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_&,_const_std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_*>
::increment(btree_iterator<const_phmap::priv::btree_node<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_false>_>,_const_std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_&,_const_std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_*>
            *this)

{
  bool bVar1;
  byte bVar2;
  int iVar3;
  
  bVar1 = btree_node<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_false>_>
          ::leaf(this->node);
  if (bVar1) {
    iVar3 = this->position + 1;
    this->position = iVar3;
    bVar2 = btree_node<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_false>_>
            ::count(this->node);
    if (iVar3 < (int)(uint)bVar2) {
      return;
    }
  }
  increment_slow(this);
  return;
}

Assistant:

void increment() {
            if (node->leaf() && ++position < node->count()) {
                return;
            }
            increment_slow();
        }